

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

unsigned_long_long
pugi::impl::anon_unknown_0::string_to_integer<unsigned_long_long>
          (char_t *value,unsigned_long_long minv,unsigned_long_long maxv)

{
  byte bVar1;
  unsigned_long_long uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  char_t *s;
  char *pcVar6;
  ulong uVar7;
  char_t *pcVar8;
  char cVar9;
  uint uVar10;
  int iVar11;
  char_t *pcVar12;
  bool bVar13;
  
  lVar4 = 0;
  do {
    lVar3 = lVar4;
    bVar1 = value[lVar3];
    lVar4 = lVar3 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
  uVar5 = (ulong)((bVar1 - 0x2b & 0xfd) == 0);
  if ((value[lVar3 + uVar5] == '0') && ((value[lVar4 + uVar5] & 0xdfU) == 0x58)) {
    pcVar6 = value + lVar4 + uVar5 + 1;
    do {
      cVar9 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar9 == '0');
    uVar7 = 0;
    uVar5 = 0;
    do {
      uVar10 = (int)cVar9 - 0x30;
      if (uVar10 < 10) {
        uVar5 = uVar5 << 4 | (ulong)uVar10;
      }
      else {
        uVar10 = (int)cVar9 | 0x20;
        if (5 < uVar10 - 0x61) goto LAB_0012b524;
        uVar5 = uVar5 * 0x10 + (ulong)(uVar10 - 0x57);
      }
      cVar9 = *pcVar6;
      uVar7 = uVar7 + 1;
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
  pcVar8 = (char_t *)(uVar5 + lVar4);
  do {
    pcVar12 = pcVar8;
    cVar9 = value[(long)(pcVar12 + -1)];
    iVar11 = (int)cVar9;
    pcVar8 = pcVar12 + 1;
  } while (iVar11 == 0x30);
  pcVar12 = value + (long)(pcVar12 + -1);
  uVar5 = 0;
  while (iVar11 - 0x30U < 10) {
    uVar5 = (ulong)(iVar11 - 0x30U) + uVar5 * 10;
    pcVar6 = pcVar12 + 1;
    pcVar12 = pcVar12 + 1;
    iVar11 = (int)*pcVar6;
  }
  if ((char_t *)0x13 < pcVar12 + (-(long)pcVar8 - (long)value) + 2) {
    bVar13 = true;
    if (pcVar12 + (-0x12 - (long)value) != pcVar8) goto LAB_0012b540;
    if ('0' < cVar9) {
      bVar13 = -1 < (long)uVar5 || cVar9 != '1';
      goto LAB_0012b540;
    }
  }
  bVar13 = false;
LAB_0012b540:
  if (bVar1 != 0x2d) {
    if (maxv <= uVar5) {
      uVar5 = maxv;
    }
    if (bVar13) {
      uVar5 = maxv;
    }
    return uVar5;
  }
  uVar2 = -uVar5;
  if (-minv < uVar5) {
    uVar2 = minv;
  }
  if (bVar13) {
    uVar2 = minv;
  }
  return uVar2;
LAB_0012b524:
  bVar13 = 0x10 < uVar7;
  goto LAB_0012b540;
}

Assistant:

PUGI_IMPL_FN PUGI_IMPL_UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI_IMPL_STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}